

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O3

void __thiscall fineftp::FtpSession::handleFtpCommandLIST(FtpSession *this,string *param)

{
  pointer pcVar1;
  element_type *peVar2;
  ulong uVar3;
  int iVar4;
  FileType FVar5;
  bool bVar6;
  _Alloc_hider _Var7;
  string path2dst;
  string local_path;
  FileStatus dir_status;
  undefined1 local_158 [48];
  string local_128;
  string local_108;
  FileStatus local_e8;
  
  peVar2 = (this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_e8.path_._M_dataplus._M_p = (pointer)&local_e8.path_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Not logged in","");
    sendFtpMessage(this,NOT_LOGGED_IN,&local_e8.path_);
  }
  else {
    if ((peVar2->permissions_ & DirList) != None) {
      local_128._M_string_length = 0;
      local_128.field_2._M_local_buf[0] = '\0';
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      iVar4 = ::std::__cxx11::string::compare((char *)param);
      if ((((iVar4 == 0) || (iVar4 = ::std::__cxx11::string::compare((char *)param), iVar4 == 0)) ||
          (iVar4 = ::std::__cxx11::string::compare((char *)param), iVar4 == 0)) ||
         (iVar4 = ::std::__cxx11::string::compare((char *)param), iVar4 == 0)) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&local_128,0,(char *)local_128._M_string_length,0x1375d3);
      }
      else {
        ::std::__cxx11::string::substr((ulong)&local_e8,(ulong)param);
        iVar4 = ::std::__cxx11::string::compare((char *)&local_e8);
        if (iVar4 == 0) {
          bVar6 = 3 < param->_M_string_length;
        }
        else {
          ::std::__cxx11::string::substr((ulong)local_158,(ulong)param);
          iVar4 = ::std::__cxx11::string::compare(local_158);
          uVar3 = param->_M_string_length;
          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
            operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
          }
          bVar6 = iVar4 == 0 && 3 < uVar3;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.path_._M_dataplus._M_p != &local_e8.path_.field_2) {
          operator_delete(local_e8.path_._M_dataplus._M_p,
                          local_e8.path_.field_2._M_allocated_capacity + 1);
        }
        if (bVar6) {
          ::std::__cxx11::string::substr((ulong)&local_e8,(ulong)param);
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_e8,(ulong)param);
          iVar4 = ::std::__cxx11::string::compare((char *)&local_e8);
          if (iVar4 == 0) {
            bVar6 = 4 < param->_M_string_length;
          }
          else {
            ::std::__cxx11::string::substr((ulong)local_158,(ulong)param);
            iVar4 = ::std::__cxx11::string::compare(local_158);
            uVar3 = param->_M_string_length;
            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
              operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
            }
            bVar6 = iVar4 == 0 && 4 < uVar3;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.path_._M_dataplus._M_p != &local_e8.path_.field_2) {
            operator_delete(local_e8.path_._M_dataplus._M_p,
                            local_e8.path_.field_2._M_allocated_capacity + 1);
          }
          if (!bVar6) {
            ::std::__cxx11::string::_M_assign((string *)&local_128);
            goto LAB_00118303;
          }
          ::std::__cxx11::string::substr((ulong)&local_e8,(ulong)param);
        }
        ::std::__cxx11::string::operator=((string *)&local_128,(string *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.path_._M_dataplus._M_p != &local_e8.path_.field_2) {
          operator_delete(local_e8.path_._M_dataplus._M_p,
                          local_e8.path_.field_2._M_allocated_capacity + 1);
        }
      }
LAB_00118303:
      toLocalPath(&local_108,this,&local_128);
      Filesystem::FileStatus::FileStatus(&local_e8,(string *)&local_108);
      bVar6 = Filesystem::FileStatus::isOk(&local_e8);
      if (bVar6) {
        FVar5 = Filesystem::FileStatus::type(&local_e8);
        if (FVar5 != Dir) {
          local_158._0_8_ = local_158 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_158,"Path is not a directory","");
          sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_158);
          goto LAB_00118451;
        }
        bVar6 = Filesystem::FileStatus::canOpenDir(&local_e8);
        pcVar1 = local_158 + 0x10;
        local_158._0_8_ = pcVar1;
        if (!bVar6) {
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_158,"Permission denied","");
          sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_158);
          goto LAB_00118451;
        }
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_158,"Sending directory listing","");
        sendFtpMessage(this,FILE_STATUS_OK_OPENING_DATA_CONNECTION,(string *)local_158);
        if ((pointer)local_158._0_8_ != pcVar1) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
        }
        Filesystem::dirContent
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                    *)local_158,(string *)&local_108);
        sendDirectoryListing
                  (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                         *)local_158);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                     *)local_158);
      }
      else {
        local_158._0_8_ = local_158 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_158,"Path does not exist","");
        sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_158);
LAB_00118451:
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
        }
      }
      Filesystem::FileStatus::~FileStatus(&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p == &local_128.field_2) {
        return;
      }
      local_e8.path_.field_2._M_allocated_capacity =
           CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,local_128.field_2._M_local_buf[0])
      ;
      _Var7._M_p = local_128._M_dataplus._M_p;
      goto LAB_0011849b;
    }
    local_e8.path_._M_dataplus._M_p = (pointer)&local_e8.path_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Permission denied","");
    sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,&local_e8.path_);
  }
  _Var7._M_p = local_e8.path_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.path_._M_dataplus._M_p == &local_e8.path_.field_2) {
    return;
  }
LAB_0011849b:
  operator_delete(_Var7._M_p,local_e8.path_.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void FtpSession::handleFtpCommandLIST(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }

    // RFC 959 does not allow ACTION_NOT_TAKEN (-> permanent error), so we return a temporary error (FILE_ACTION_NOT_TAKEN).
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirList) == 0)
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    // Deal with some unusual commands like "LIST -a", "LIST -a dirname".
    // Some FTP clients send those commands, as if they would call ls on unix.
    // 
    // We try to support those parameters (or rather ignore them), even though
    // this techniqually breaks listing directories that actually use "-a" etc.
    // as directory name. As most clients however first CWD into a directory and
    // call LIST without parameter afterwards and starting a directory name with
    // "-a " / "-l " / "-al " / "-la " is not that common, the compatibility
    // benefit should outperform te potential problems by a lot.
    // 
    // The RFC-violating LIST command now shall be:
    // 
    //   LIST [<SP> <arg>] [<SP> <pathname>] <CRLF>
    // 
    //   with:
    // 
    //     <arg> ::= -a
    //             | -l
    //             | -al
    //             | -la
    //

    std::string path2dst;
    if ((param == "-a") || (param == "-l") || (param == "-al") || (param == "-la"))
    {
      path2dst  = "";
    }
    else if ((param.substr(0, 3)=="-a "|| param.substr(0, 3)=="-l ") && (param.size() > 3))
    {
      path2dst = param.substr(3);
    }
    else if ((param.substr(0, 4) == "-al " || param.substr(0, 4) == "-la ") && (param.size() > 4))
    {
      path2dst = param.substr(4);
    }
    else
    {
      path2dst = param;
    }

    std::string local_path = toLocalPath(path2dst);
    auto dir_status = Filesystem::FileStatus(local_path);

    if (dir_status.isOk())
    {
      if (dir_status.type() == Filesystem::FileType::Dir)
      {
        if (dir_status.canOpenDir())
        {
          sendFtpMessage(FtpReplyCode::FILE_STATUS_OK_OPENING_DATA_CONNECTION, "Sending directory listing");
          sendDirectoryListing(Filesystem::dirContent(local_path));
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
          return;
        }
      }
      else
      {
        // TODO: RFC959: If the pathname specifies a file then the server should send current information on the file.
        sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path is not a directory");
        return;
      }
    }
    else
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path does not exist");
      return;
    }
  }